

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::setNeedAppearances(QPDFAcroFormDocumentHelper *this,bool val)

{
  bool bVar1;
  allocator<char> local_101;
  string local_100;
  QPDFObjectHandle local_e0;
  allocator<char> local_c9;
  string local_c8;
  undefined4 local_a8;
  allocator<char> local_a1;
  string local_a0;
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [24];
  QPDFObjectHandle acroform;
  bool val_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = val;
  QPDF::getRoot((QPDF *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/AcroForm",&local_59);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_38 + 0x10),(string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_38 + 0x10));
  if (bVar1) {
    if ((acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"/NeedAppearances",&local_101);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)(local_38 + 0x10),&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"/NeedAppearances",&local_c9);
      QPDFObjectHandle::newBool(&local_e0,true);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)(local_38 + 0x10),&local_c8,&local_e0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    local_a8 = 0;
  }
  else {
    QPDF::getRoot((QPDF *)local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               "ignoring call to QPDFAcroFormDocumentHelper::setNeedAppearances on a file that lacks an /AcroForm dictionary"
               ,&local_a1);
    QPDFObjectHandle::warnIfPossible(local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    QPDFObjectHandle::~QPDFObjectHandle(local_80);
    local_a8 = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_38 + 0x10));
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::setNeedAppearances(bool val)
{
    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        qpdf.getRoot().warnIfPossible(
            "ignoring call to QPDFAcroFormDocumentHelper::setNeedAppearances"
            " on a file that lacks an /AcroForm dictionary");
        return;
    }
    if (val) {
        acroform.replaceKey("/NeedAppearances", QPDFObjectHandle::newBool(true));
    } else {
        acroform.removeKey("/NeedAppearances");
    }
}